

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_opcode_s(Context *ctx,char *opcode)

{
  long lVar1;
  undefined8 src;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStack_60;
  char local_58 [8];
  char src0 [64];
  char *opcode_local;
  Context *ctx_local;
  
  uStack_60 = 0x123276;
  src0._56_8_ = opcode;
  make_D3D_srcarg_string(ctx,0,local_58,0x40);
  uStack_60 = 0x12327f;
  sVar2 = strlen((char *)src0._56_8_);
  src = src0._56_8_;
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x123299;
  pcVar3 = lowercase(local_58 + lVar1,(char *)src);
  pcVar4 = "";
  if (ctx->coissue != 0) {
    pcVar4 = "+";
  }
  src0._56_8_ = pcVar3;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1232d6;
  output_line(ctx,"%s%s %s",pcVar4,pcVar3,local_58);
  return;
}

Assistant:

static void emit_D3D_opcode_s(Context *ctx, const char *opcode)
{
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s %s", ctx->coissue ? "+" : "", opcode, src0);
}